

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReFinalize.cpp
# Opt level: O1

void __thiscall wasm::ReFinalize::visitResumeThrow(ReFinalize *this,ResumeThrow *curr)

{
  Name *pNVar1;
  ulong uVar2;
  long lVar3;
  Name name;
  
  ResumeThrow::finalize(curr);
  if ((curr->handlerBlocks).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
      != 0) {
    lVar3 = 8;
    uVar2 = 0;
    do {
      if ((curr->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.usedElements
          <= uVar2) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Type>, wasm::Type>::operator[](size_t) const [SubType = ArenaVector<wasm::Type>, T = wasm::Type]"
                     );
      }
      pNVar1 = (curr->handlerBlocks).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data
      ;
      name.super_IString.str._M_str = *(char **)((long)&(pNVar1->super_IString).str._M_len + lVar3);
      name.super_IString.str._M_len = *(size_t *)((long)pNVar1 + lVar3 + -8);
      updateBreakValueType
                (this,name,
                 (Type)(curr->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>.
                       data[uVar2].id);
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < (curr->handlerBlocks).
                     super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements);
  }
  return;
}

Assistant:

void ReFinalize::visitResumeThrow(ResumeThrow* curr) {
  curr->finalize();
  for (size_t i = 0; i < curr->handlerBlocks.size(); i++) {
    updateBreakValueType(curr->handlerBlocks[i], curr->sentTypes[i]);
  }
}